

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict declaration(c2m_ctx_t c2m_ctx,int no_err_p)

{
  token_t ptVar1;
  undefined8 uVar2;
  node_t_conflict pnVar3;
  node *n;
  node_t_conflict pnVar4;
  node_t_conflict pnVar5;
  node_t_conflict op4;
  node_t_conflict op;
  node_t pnVar6;
  char *pcVar7;
  parse_ctx_t parse_ctx;
  parse_ctx *ppVar8;
  pos_t pVar9;
  pos_t pVar10;
  node_t_conflict in_stack_ffffffffffffff78;
  node_t_conflict asm_part;
  uint local_6c;
  parse_ctx *local_68;
  node_t_conflict local_60;
  node_t_conflict local_58;
  node_t_conflict local_50;
  tpname_t local_48;
  
  ppVar8 = c2m_ctx->parse_ctx;
  asm_part = (node_t_conflict)0x0;
  ptVar1 = ppVar8->curr_token;
  if (*(short *)ptVar1 == 0x117) {
    pnVar3 = st_assert(c2m_ctx,no_err_p);
    return pnVar3;
  }
  if (*(short *)ptVar1 == 0x3b) {
    pcVar7 = (ptVar1->pos).fname;
    uVar2._0_4_ = (ptVar1->pos).lno;
    uVar2._4_4_ = (ptVar1->pos).ln_pos;
    read_token(c2m_ctx);
    n = new_node(c2m_ctx,N_LIST);
    if ((ppVar8->curr_scope == c2m_ctx->top_scope) && (c2m_ctx->options->pedantic_p != 0)) {
      warning(c2m_ctx,0x1c37db,pcVar7,uVar2);
    }
  }
  else {
    try_attr_spec(c2m_ctx,ppVar8->curr_token->pos,(node_t_conflict *)0x0);
    pnVar3 = declaration_specs(c2m_ctx,no_err_p,
                               (node_t_conflict)(ulong)(ppVar8->curr_scope == c2m_ctx->top_scope));
    n = &err_struct;
    if (pnVar3 != &err_struct) {
      get_node_pos(c2m_ctx,pnVar3);
      n = new_node(c2m_ctx,N_LIST);
      local_68 = ppVar8;
      if (*(short *)ppVar8->curr_token == 0x3b) {
        pnVar4 = new_node(c2m_ctx,N_IGNORE);
        pnVar5 = new_node(c2m_ctx,N_IGNORE);
        op4 = new_node(c2m_ctx,N_IGNORE);
        op = new_node(c2m_ctx,N_IGNORE);
        pnVar3 = new_node4(c2m_ctx,N_SPEC_DECL,pnVar3,pnVar4,pnVar5,op4);
        op_append(c2m_ctx,pnVar3,op);
        op_append(c2m_ctx,n,pnVar3);
LAB_00196672:
        if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3b) {
          read_token(c2m_ctx);
        }
        else {
          if (local_68->record_level == 0) {
            pcVar7 = get_token_name(c2m_ctx,0x3b);
            syntax_error(c2m_ctx,pcVar7);
          }
LAB_00196879:
          n = &err_struct;
        }
      }
      else {
        for (pnVar6 = (pnVar3->u).ops.head; (pnVar6 != (node_t)0x0 && (pnVar6->code != N_TYPEDEF));
            pnVar6 = (pnVar6->op_link).next) {
        }
        local_58 = n;
        pnVar4 = declarator(c2m_ctx,no_err_p);
        n = &err_struct;
        if (pnVar4 != &err_struct) {
          local_6c = (uint)(pnVar6 != (node_t)0x0);
          local_60 = pnVar3;
          do {
            pVar9 = get_node_pos(c2m_ctx,pnVar4);
            if (pnVar4->code != N_DECL) {
              __assert_fail("decl->code == N_DECL",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                            ,0x1135,"node_t declaration(c2m_ctx_t, int)");
            }
            tpname_add(&local_48,c2m_ctx,(pnVar4->u).ops.head,ppVar8->curr_scope,local_6c);
            pnVar3 = try_attr_spec(c2m_ctx,pVar9,&asm_part);
            if (pnVar3 == &err_struct) {
              pnVar3 = new_node(c2m_ctx,N_IGNORE);
            }
            if (asm_part == (node_t_conflict)0x0) {
              asm_part = new_node(c2m_ctx,N_IGNORE);
            }
            if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3d) {
              read_token(c2m_ctx);
              pnVar5 = initializer(c2m_ctx,no_err_p);
              if (pnVar5 == &err_struct) goto LAB_00196879;
            }
            else {
              pnVar5 = new_node(c2m_ctx,N_IGNORE);
            }
            pVar10 = get_node_pos(c2m_ctx,pnVar4);
            pVar9.fname = pVar10._8_8_;
            local_50 = pnVar3;
            pnVar3 = new_node(c2m_ctx,N_SHARE);
            op_append(c2m_ctx,pnVar3,local_60);
            pVar9._8_8_ = pnVar3;
            pnVar3 = new_pos_node5(c2m_ctx,(node_code_t)pVar10.fname,pVar9,pnVar4,local_50,asm_part,
                                   pnVar5,in_stack_ffffffffffffff78);
            n = local_58;
            op_append(c2m_ctx,local_58,pnVar3);
            if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x2c) goto LAB_00196672;
            read_token(c2m_ctx);
            pnVar4 = declarator(c2m_ctx,no_err_p);
            n = &err_struct;
            ppVar8 = local_68;
          } while (pnVar4 != &err_struct);
        }
      }
    }
  }
  return n;
}

Assistant:

D (declaration) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  int typedef_p;
  node_t op, list, decl, spec, r, attrs, asm_part = NULL;
  pos_t pos, last_pos;

  if (C (T_STATIC_ASSERT)) {
    P (st_assert);
  } else if (MP (';', pos)) {
    r = new_node (c2m_ctx, N_LIST);
    if (curr_scope == top_scope && c2m_options->pedantic_p)
      warning (c2m_ctx, pos, "extra ; outside of a function");
  } else {
    try_attr_spec (c2m_ctx, curr_token->pos, NULL);
    PA (declaration_specs, curr_scope == top_scope ? (node_t) 1 : NULL);
    spec = r;
    last_pos = POS (spec);
    list = new_node (c2m_ctx, N_LIST);
    if (C (';')) {
      op_append (c2m_ctx, list,
                 new_node5 (c2m_ctx, N_SPEC_DECL, spec, new_node (c2m_ctx, N_IGNORE),
                            new_node (c2m_ctx, N_IGNORE), new_node (c2m_ctx, N_IGNORE),
                            new_node (c2m_ctx, N_IGNORE)));
    } else { /* init-declarator-list */
      for (op = NL_HEAD (spec->u.ops); op != NULL; op = NL_NEXT (op))
        if (op->code == N_TYPEDEF) break;
      typedef_p = op != NULL;
      for (;;) { /* init-declarator */
        P (declarator);
        decl = r;
        last_pos = POS (decl);
        assert (decl->code == N_DECL);
        op = NL_HEAD (decl->u.ops);
        tpname_add (c2m_ctx, op, curr_scope, typedef_p);
        attrs = try_attr_spec (c2m_ctx, last_pos, &asm_part);
        if (attrs == err_node) attrs = new_node (c2m_ctx, N_IGNORE);
        if (asm_part == NULL) asm_part = new_node (c2m_ctx, N_IGNORE);
        if (M ('=')) {
          P (initializer);
        } else {
          r = new_node (c2m_ctx, N_IGNORE);
        }
        op_append (c2m_ctx, list,
                   new_pos_node5 (c2m_ctx, N_SPEC_DECL, POS (decl),
                                  new_node1 (c2m_ctx, N_SHARE, spec), decl, attrs, asm_part, r));
        if (!M (',')) break;
      }
    }
    r = list;
    PT (';');
  }
  return r;
}